

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

shared_ptr<duckdb::ColumnData,_true> __thiscall
duckdb::ColumnData::Deserialize
          (ColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index,
          idx_t start_row,ReadStream *source,LogicalType *type)

{
  DatabaseInstance *__args;
  ColumnData *pCVar1;
  ColumnData *pCVar2;
  pointer pSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ColumnData,_true> sVar4;
  CompressionInfo compression_info;
  PersistentColumnData persistent_column_data;
  BinaryDeserializer deserializer;
  CompressionInfo local_300;
  PersistentColumnData local_2f8;
  undefined1 local_2b8 [144];
  _Elt_pointer local_228;
  _Elt_pointer local_218;
  deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
  local_118 [48];
  _Elt_pointer local_e8;
  _Elt_pointer local_d8;
  deque<std::reference_wrapper<duckdb::CompressionInfo_const>,std::allocator<std::reference_wrapper<duckdb::CompressionInfo_const>>>
  local_c8 [48];
  _Elt_pointer local_98;
  _Elt_pointer local_88;
  ReadStream *local_40;
  idx_t local_38;
  bool local_30;
  field_id_t local_2e;
  
  CreateColumn(this,block_manager,info,column_index,start_row,
               (LogicalType *)compression_info.block_manager,
               (optional_ptr<duckdb::ColumnData,_true>)0x0);
  local_2b8._0_8_ = &PTR__Deserializer_02478928;
  local_2b8[8] = false;
  SerializationData::SerializationData((SerializationData *)(local_2b8 + 0x10));
  local_2b8._0_8_ = &PTR__Deserializer_02478738;
  local_38 = 0;
  local_30 = false;
  local_2e = 0;
  local_2b8[8] = false;
  local_40 = source;
  BinaryDeserializer::OnObjectBegin((BinaryDeserializer *)local_2b8);
  __args = info->db->db;
  if (local_228 == local_218 + -1) {
    ::std::
    deque<std::reference_wrapper<duckdb::DatabaseInstance>,std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>>>
    ::_M_push_back_aux<duckdb::DatabaseInstance&>
              ((deque<std::reference_wrapper<duckdb::DatabaseInstance>,std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>>>
                *)(local_2b8 + 0x60),__args);
  }
  else {
    local_228->_M_data = __args;
    local_228 = local_228 + 1;
  }
  local_300.block_manager = block_manager;
  if (local_98 == local_88 + -1) {
    ::std::
    deque<std::reference_wrapper<duckdb::CompressionInfo_const>,std::allocator<std::reference_wrapper<duckdb::CompressionInfo_const>>>
    ::_M_push_back_aux<duckdb::CompressionInfo_const&>(local_c8,&local_300);
  }
  else {
    local_98->_M_data = &local_300;
    local_98 = local_98 + 1;
  }
  if (local_e8 == local_d8 + -1) {
    ::std::
    deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
    ::_M_push_back_aux<duckdb::LogicalType_const&>
              (local_118,(LogicalType *)compression_info.block_manager);
  }
  else {
    local_e8->_M_data = (LogicalType *)compression_info.block_manager;
    local_e8 = local_e8 + 1;
  }
  PersistentColumnData::Deserialize(&local_2f8,(Deserializer *)local_2b8);
  Deserializer::Unset<duckdb::LogicalType>((Deserializer *)local_2b8);
  Deserializer::Unset<duckdb::CompressionInfo_const>((Deserializer *)local_2b8);
  Deserializer::Unset<duckdb::DatabaseInstance>((Deserializer *)local_2b8);
  BinaryDeserializer::OnObjectEnd((BinaryDeserializer *)local_2b8);
  pCVar1 = shared_ptr<duckdb::ColumnData,_true>::operator->
                     ((shared_ptr<duckdb::ColumnData,_true> *)this);
  pCVar2 = shared_ptr<duckdb::ColumnData,_true>::operator->
                     ((shared_ptr<duckdb::ColumnData,_true> *)this);
  pSVar3 = unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>
           ::operator->(&pCVar2->stats);
  (*pCVar1->_vptr_ColumnData[0x20])(pCVar1,&local_2f8,pSVar3);
  PersistentColumnData::~PersistentColumnData(&local_2f8);
  Deserializer::~Deserializer((Deserializer *)local_2b8);
  sVar4.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::ColumnData,_true>)
         sVar4.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnData> ColumnData::Deserialize(BlockManager &block_manager, DataTableInfo &info, idx_t column_index,
                                               idx_t start_row, ReadStream &source, const LogicalType &type) {
	auto entry = ColumnData::CreateColumn(block_manager, info, column_index, start_row, type, nullptr);

	// deserialize the persistent column data
	BinaryDeserializer deserializer(source);
	deserializer.Begin();
	deserializer.Set<DatabaseInstance &>(info.GetDB().GetDatabase());
	CompressionInfo compression_info(block_manager);
	deserializer.Set<const CompressionInfo &>(compression_info);
	deserializer.Set<const LogicalType &>(type);
	auto persistent_column_data = PersistentColumnData::Deserialize(deserializer);
	deserializer.Unset<LogicalType>();
	deserializer.Unset<const CompressionInfo>();
	deserializer.Unset<DatabaseInstance>();
	deserializer.End();

	// initialize the column
	entry->InitializeColumn(persistent_column_data, entry->stats->statistics);
	return entry;
}